

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModelValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)556>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  LinkedModel *pLVar2;
  LinkedModelFile *from;
  Result *this;
  ModelDescription *interface;
  allocator local_89;
  Result result;
  LinkedModelFile linkedFileSpec;
  string local_38;
  
  interface = format->description_;
  if (interface == (ModelDescription *)0x0) {
    interface = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  if (format->_oneof_case_[0] == 0x22c) {
    if (format->isupdatable_ != true) {
      Result::Result(&result);
      validateModelDescription((Result *)&linkedFileSpec,interface,format->specificationversion_);
      Result::operator=(&result,(Result *)&linkedFileSpec);
      std::__cxx11::string::~string((string *)&linkedFileSpec._internal_metadata_);
      bVar1 = Result::good(&result);
      if (bVar1) {
        pLVar2 = Specification::Model::linkedmodel(format);
        if (pLVar2->_oneof_case_[0] == 0) {
          std::__cxx11::string::string
                    ((string *)&linkedFileSpec,"LinkedModel.LinkType not set.",
                     (allocator *)&local_38);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&linkedFileSpec);
          std::__cxx11::string::~string((string *)&linkedFileSpec);
        }
        else {
          pLVar2 = Specification::Model::linkedmodel(format);
          from = Specification::LinkedModel::linkedmodelfile(pLVar2);
          Specification::LinkedModelFile::LinkedModelFile(&linkedFileSpec,from);
          if (linkedFileSpec.linkedmodelfilename_ == (StringParameter *)0x0) {
            linkedFileSpec.linkedmodelfilename_ =
                 (StringParameter *)&Specification::_StringParameter_default_instance_;
          }
          if ((((linkedFileSpec.linkedmodelfilename_)->defaultvalue_).ptr_)->_M_string_length == 0)
          {
            std::__cxx11::string::string
                      ((string *)&local_38,
                       "LinkedModel.linkedModelFile.linkedModeFileName.defaultValue cannot be empty."
                       ,&local_89);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_38);
            std::__cxx11::string::~string((string *)&local_38);
          }
          else {
            Result::Result(__return_storage_ptr__,&result);
          }
          Specification::LinkedModelFile::~LinkedModelFile(&linkedFileSpec);
        }
      }
      else {
        Result::Result(__return_storage_ptr__,&result);
      }
      this = (Result *)&result.m_message;
      goto LAB_0055d8e0;
    }
    std::__cxx11::string::string
              ((string *)&result,"LinkedModel cannot be marked as updatable",
               (allocator *)&linkedFileSpec);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&result);
  }
  else {
    std::__cxx11::string::string
              ((string *)&result,"Model not an a LinkedModel.",(allocator *)&linkedFileSpec);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&result);
  }
  this = &result;
LAB_0055d8e0:
  std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_linkedModel>(const Specification::Model& format) {
        const auto& interface = format.description();

        // Make sure that if there is a double output type, there is exactly one output index selected.
        if (!format.has_linkedmodel()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Model not an a LinkedModel.");
        }

        if (format.isupdatable()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "LinkedModel cannot be marked as updatable");
        }
        
        Result result;

        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        if (format.linkedmodel().LinkType_case() == Specification::LinkedModel::LINKTYPE_NOT_SET) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "LinkedModel.LinkType not set.");
        }

        auto linkedFileSpec = format.linkedmodel().linkedmodelfile();
        if (linkedFileSpec.linkedmodelfilename().defaultvalue().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "LinkedModel.linkedModelFile.linkedModeFileName.defaultValue cannot be empty.");
        }

        if (linkedFileSpec.linkedmodelsearchpath().defaultvalue().empty()) {
            // This is allowed and is the same as having "." or "./" as search path
        }

        return result;
    }